

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::SerializeWithCachedSizes
          (NonMaximumSuppressionLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint64 uVar2;
  float fVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NonMaximumSuppressionLayerParams *this_local;
  
  fVar3 = iouthreshold(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = iouthreshold(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar3,output);
  }
  fVar3 = scorethreshold(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = scorethreshold(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar3,output);
  }
  uVar2 = maxboxes(this);
  if (uVar2 != 0) {
    uVar2 = maxboxes(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(3,uVar2,output);
  }
  bVar1 = perclasssuppression(this);
  if (bVar1) {
    bVar1 = perclasssuppression(this);
    google::protobuf::internal::WireFormatLite::WriteBool(4,bVar1,output);
  }
  return;
}

Assistant:

void NonMaximumSuppressionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NonMaximumSuppressionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float iouThreshold = 1;
  if (this->iouthreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->iouthreshold(), output);
  }

  // float scoreThreshold = 2;
  if (this->scorethreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->scorethreshold(), output);
  }

  // uint64 maxBoxes = 3;
  if (this->maxboxes() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(3, this->maxboxes(), output);
  }

  // bool perClassSuppression = 4;
  if (this->perclasssuppression() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(4, this->perclasssuppression(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NonMaximumSuppressionLayerParams)
}